

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O1

void create_cb(uv_fs_t *req)

{
  ssize_t sVar1;
  undefined8 __s1;
  int iVar2;
  ulong uVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  ulong uVar6;
  uint uVar7;
  uv_os_fd_t file;
  uv__queue *unaff_RBX;
  uv__queue *puVar8;
  char *pcVar9;
  uv_fs_t *puVar10;
  uv_fs_t *puVar11;
  uv_fs_cb unaff_R12;
  char *unaff_R13;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_buf_t uVar12;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStackY_1b8 [32];
  code *pcStackY_198;
  undefined1 auStackY_190 [16];
  uv_req_type uStackY_180;
  void *pvStackY_178;
  uv_loop_t *puStackY_170;
  uv_fs_cb p_StackY_168;
  char *pcStackY_160;
  uv_fs_t *puStackY_158;
  uv_dirent_t *puStackY_150;
  uv_fs_cb p_StackY_140;
  undefined1 auStackY_138 [16];
  uv_loop_t *puStackY_128;
  uv_dirent_t uStackY_120;
  char *pcStackY_110;
  uint64_t uStack_98;
  uv_loop_t *puStack_90;
  uv_loop_s *puStack_50;
  uv__queue *puStack_48;
  _func_void_uv__work_ptr *p_Stack_38;
  undefined1 auStack_30 [8];
  uv_buf_t *local_10;
  
  puVar8 = (uv__queue *)open_req1.result;
  if (req == &open_req1) {
    local_10 = (uv_buf_t *)(long)open_req1.fs_type;
    if (local_10 != (uv_buf_t *)0x1) goto LAB_0018a1bc;
    local_10 = (uv_buf_t *)open_req1.result;
    if (open_req1.result < 0) goto LAB_0018a1cb;
    create_cb_count = create_cb_count + 1;
    auStack_30 = (undefined1  [8])0x18a142;
    uv_fs_req_cleanup(&open_req1);
    auStack_30 = (undefined1  [8])0x18a153;
    iov = uv_buf_init(test_buf,0xd);
    auStack_30 = (undefined1  [8])0x18a195;
    iVar2 = uv_fs_write(loop,&write_req,(uv_os_fd_t)puVar8,&iov,1,-1,write_cb);
    local_10 = (uv_buf_t *)(long)iVar2;
    if (local_10 == (uv_buf_t *)0x0) {
      return;
    }
  }
  else {
    auStack_30 = (undefined1  [8])0x18a1bc;
    create_cb_cold_1();
    puVar8 = unaff_RBX;
LAB_0018a1bc:
    auStack_30 = (undefined1  [8])0x18a1cb;
    create_cb_cold_2();
LAB_0018a1cb:
    auStack_30 = (undefined1  [8])0x18a1da;
    create_cb_cold_4();
  }
  puVar11 = (uv_fs_t *)&stack0xfffffffffffffff0;
  auStack_30 = (undefined1  [8])rename_cb;
  create_cb_cold_3();
  if (puVar11 == &rename_req) {
    auStack_30 = (undefined1  [8])(long)rename_req.fs_type;
    p_Stack_38 = (_func_void_uv__work_ptr *)0x15;
    if (auStack_30 != (undefined1  [8])0x15) goto LAB_0018a256;
    auStack_30 = (undefined1  [8])rename_req.result;
    p_Stack_38 = (_func_void_uv__work_ptr *)0x0;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return;
    }
  }
  else {
    puStack_48 = (uv__queue *)0x18a256;
    rename_cb_cold_1();
LAB_0018a256:
    puStack_48 = (uv__queue *)0x18a265;
    rename_cb_cold_2();
  }
  puVar11 = (uv_fs_t *)auStack_30;
  puStack_48 = (uv__queue *)open_cb;
  rename_cb_cold_3();
  sVar1 = open_req1.result;
  puStack_48 = puVar8;
  if (puVar11 == &open_req1) {
    puStack_50 = (uv_loop_s *)(long)open_req1.fs_type;
    if (puStack_50 != (uv_loop_s *)0x1) goto LAB_0018a3c3;
    if (open_req1.result < 0) goto LAB_0018a3d2;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_0018a3d9;
    uVar3 = 0x746573745f66696c;
    uVar6 = *(ulong *)open_req1.path;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    if (uVar6 == 0x746573745f66696c) {
      uVar3 = 0x745f66696c653200;
      uVar6 = *(ulong *)(open_req1.path + 3);
      uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      uVar7 = 0;
      if (uVar6 != 0x745f66696c653200) goto LAB_0018a301;
    }
    else {
LAB_0018a301:
      uVar7 = -(uint)(uVar6 < uVar3) | 1;
    }
    puStack_50 = (uv_loop_s *)(long)(int)uVar7;
    if (puStack_50 != (uv_loop_s *)0x0) goto LAB_0018a3de;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar12 = uv_buf_init(buf,0x20);
    iov = uVar12;
    iVar2 = uv_fs_read(loop,&read_req,(uv_os_fd_t)sVar1,&iov,1,-1,read_cb);
    puStack_50 = (uv_loop_s *)(long)iVar2;
    if (puStack_50 == (uv_loop_s *)0x0) {
      return;
    }
  }
  else {
    open_cb_cold_1();
LAB_0018a3c3:
    open_cb_cold_2();
LAB_0018a3d2:
    open_cb_cold_6();
LAB_0018a3d9:
    open_cb_cold_5();
LAB_0018a3de:
    open_cb_cold_3();
  }
  iVar2 = (int)&puStack_50;
  open_cb_cold_4();
  fs_file_sync(iVar2);
  fs_file_sync(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_sync_cold_1();
  puStack_90 = puVar4;
  unlink("test_file");
  unlink("test_file2");
  loop = uv_default_loop();
  iVar2 = uv_fs_open(loop,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar1 = open_req1.result;
  uStack_98 = (uint64_t)iVar2;
  if (uStack_98 == 0) {
    if (open_req1.result < 0) goto LAB_0018aaac;
    uv_fs_req_cleanup(&open_req1);
    uVar12 = uv_buf_init(test_buf,0xd);
    unaff_R14 = (uv_fs_t *)0x0;
    iov = uVar12;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar1,&iov,1,-1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if ((long)uStack_98 < 0) goto LAB_0018aab1;
    uStack_98 = write_req.result;
    if (write_req.result < 0) goto LAB_0018aac0;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018aacf;
    uStack_98 = close_req.result;
    if (close_req.result != 0) goto LAB_0018aade;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",2,0,(uv_fs_cb)0x0);
    sVar1 = open_req1.result;
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018aaed;
    uStack_98 = open_req1.result;
    if (open_req1.result < 0) goto LAB_0018aafc;
    uv_fs_req_cleanup(&open_req1);
    uVar12 = uv_buf_init(buf,0x20);
    unaff_R14 = (uv_fs_t *)0x0;
    file = (uv_os_fd_t)sVar1;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,file,&iov,1,-1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if ((long)uStack_98 < 0) goto LAB_0018ab0b;
    uStack_98 = read_req.result;
    if (read_req.result < 0) goto LAB_0018ab1a;
    iVar2 = strcmp(buf,test_buf);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab29;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_ftruncate((uv_loop_t *)0x0,&ftruncate_req,file,7,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab38;
    uStack_98 = ftruncate_req.result;
    if (ftruncate_req.result != 0) goto LAB_0018ab47;
    uv_fs_req_cleanup(&ftruncate_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,file,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab56;
    uStack_98 = close_req.result;
    if (close_req.result != 0) goto LAB_0018ab65;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab74;
    uStack_98 = rename_req.result;
    if (rename_req.result != 0) goto LAB_0018ab83;
    uv_fs_req_cleanup(&rename_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    sVar1 = open_req1.result;
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab92;
    uStack_98 = open_req1.result;
    if (open_req1.result < 0) goto LAB_0018aba1;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar12 = uv_buf_init(buf,0x20);
    unaff_R14 = (uv_fs_t *)0x0;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_os_fd_t)sVar1,&iov,1,-1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if ((long)uStack_98 < 0) goto LAB_0018abb0;
    uStack_98 = read_req.result;
    if (read_req.result < 0) goto LAB_0018abbf;
    iVar2 = strcmp(buf,"test-bu");
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018abce;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018abdd;
    uStack_98 = close_req.result;
    if (close_req.result != 0) goto LAB_0018abec;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file2",(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018abfb;
    uStack_98 = unlink_req.result;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      unlink("test_file2");
      return;
    }
  }
  else {
    fs_file_sync_cold_1();
LAB_0018aaac:
    fs_file_sync_cold_2();
LAB_0018aab1:
    fs_file_sync_cold_26();
LAB_0018aac0:
    fs_file_sync_cold_25();
LAB_0018aacf:
    fs_file_sync_cold_3();
LAB_0018aade:
    fs_file_sync_cold_4();
LAB_0018aaed:
    fs_file_sync_cold_5();
LAB_0018aafc:
    fs_file_sync_cold_24();
LAB_0018ab0b:
    fs_file_sync_cold_23();
LAB_0018ab1a:
    fs_file_sync_cold_22();
LAB_0018ab29:
    fs_file_sync_cold_6();
LAB_0018ab38:
    fs_file_sync_cold_7();
LAB_0018ab47:
    fs_file_sync_cold_8();
LAB_0018ab56:
    fs_file_sync_cold_9();
LAB_0018ab65:
    fs_file_sync_cold_10();
LAB_0018ab74:
    fs_file_sync_cold_11();
LAB_0018ab83:
    fs_file_sync_cold_12();
LAB_0018ab92:
    fs_file_sync_cold_13();
LAB_0018aba1:
    fs_file_sync_cold_21();
LAB_0018abb0:
    fs_file_sync_cold_20();
LAB_0018abbf:
    fs_file_sync_cold_19();
LAB_0018abce:
    fs_file_sync_cold_14();
LAB_0018abdd:
    fs_file_sync_cold_15();
LAB_0018abec:
    fs_file_sync_cold_16();
LAB_0018abfb:
    fs_file_sync_cold_17();
  }
  iVar2 = (int)&uStack_98;
  fs_file_sync_cold_18();
  fs_file_write_null_buffer(iVar2);
  fs_file_write_null_buffer(iVar2);
  puVar4 = loop;
  uv_walk(loop,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  iVar2 = uv_loop_close(loop);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  pcVar9 = "test_file";
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar1 = open_req1.result;
  if (iVar2 == 0) {
    pcVar9 = (char *)open_req1.result;
    if (open_req1.result < 0) goto LAB_0018ae28;
    uv_fs_req_cleanup(&open_req1);
    unaff_R14 = (uv_fs_t *)0x0;
    uVar12 = uv_buf_init((char *)0x0,0);
    iov = uVar12;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar1,&iov,1,-1,(uv_fs_cb)0x0);
    pcVar9 = (char *)sVar1;
    if (iVar2 != 0) goto LAB_0018ae37;
    if (write_req.result != 0) goto LAB_0018ae46;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0018ae55;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  else {
    fs_file_write_null_buffer_cold_1();
LAB_0018ae28:
    fs_file_write_null_buffer_cold_6();
LAB_0018ae37:
    fs_file_write_null_buffer_cold_2();
LAB_0018ae46:
    fs_file_write_null_buffer_cold_3();
LAB_0018ae55:
    fs_file_write_null_buffer_cold_4();
  }
  fs_file_write_null_buffer_cold_5();
  puVar11 = (uv_fs_t *)(auStackY_138 + 8);
  auStackY_138._0_8_ = (void *)0x18ae8c;
  pcStackY_110 = pcVar9;
  unlink("test_dir/file1");
  auStackY_138._0_8_ = (void *)0x18ae98;
  unlink("test_dir/file2");
  puVar4 = (uv_loop_t *)0x1fafc6;
  auStackY_138._0_8_ = (void *)0x18aea7;
  rmdir("test_dir");
  auStackY_138._0_8_ = (void *)0x18aeac;
  loop = uv_default_loop();
  auStackY_138._0_8_ = (void *)0x18aed1;
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  uStackY_120.name = (char *)(long)iVar2;
  auStackY_138._8_8_ = (uv_loop_t *)0x0;
  if (uStackY_120.name == (char *)0x0) {
    auStackY_138._0_8_ = (void *)0x18aefd;
    uv_run(loop,UV_RUN_DEFAULT);
    uStackY_120.name = (char *)0x1;
    auStackY_138._8_8_ = SEXT48(mkdir_cb_count);
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x1) goto LAB_0018b51f;
    auStackY_138._0_8_ = (void *)0x18af43;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)open_req1.result;
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b52c;
    uStackY_120.name = (char *)open_req1.result;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (open_req1.result < 0) goto LAB_0018b539;
    auStackY_138._0_8_ = (void *)0x18af90;
    uv_fs_req_cleanup(&open_req1);
    auStackY_138._0_8_ = (void *)0x18afa2;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)puVar5,(uv_fs_cb)0x0);
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b546;
    auStackY_138._0_8_ = (void *)0x18afcc;
    uv_fs_req_cleanup(&close_req);
    auStackY_138._0_8_ = (void *)0x18afef;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    puVar4 = (uv_loop_t *)open_req1.result;
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b553;
    uStackY_120.name = (char *)open_req1.result;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (open_req1.result < 0) goto LAB_0018b560;
    auStackY_138._0_8_ = (void *)0x18b03c;
    uv_fs_req_cleanup(&open_req1);
    auStackY_138._0_8_ = (void *)0x18b04e;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)puVar4,(uv_fs_cb)0x0);
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b56d;
    auStackY_138._0_8_ = (void *)0x18b078;
    uv_fs_req_cleanup(&close_req);
    auStackY_138._0_8_ = (void *)0x18b09b;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b57a;
    auStackY_138._0_8_ = (void *)0x18b0c7;
    uv_run(loop,UV_RUN_DEFAULT);
    uStackY_120.name = (char *)0x1;
    auStackY_138._8_8_ = SEXT48(scandir_cb_count);
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x1) goto LAB_0018b587;
    auStackY_138._0_8_ = (void *)0x18b104;
    iVar2 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    uStackY_120.name = (char *)0x2;
    auStackY_138._8_8_ = SEXT48(iVar2);
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x2) goto LAB_0018b594;
    uStackY_120.name = (char *)0x2;
    auStackY_138._8_8_ = scandir_req.result;
    if (scandir_req.result != 2) goto LAB_0018b5a1;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0018b5ae;
    auStackY_138._0_8_ = (void *)0x18b164;
    iVar2 = uv_fs_scandir_next(&scandir_req,&uStackY_120);
    if (iVar2 != -0xfff) {
      puVar4 = (uv_loop_t *)0x1f9b18;
      unaff_R14 = &scandir_req;
      unaff_R15 = &uStackY_120;
      unaff_R12 = (uv_fs_cb)0x1f9b08;
      do {
        unaff_R13 = uStackY_120.name;
        pcVar9 = "file1";
        auStackY_138._0_8_ = (void *)0x18b195;
        iVar2 = strcmp(uStackY_120.name,"file1");
        if (iVar2 != 0) {
          pcVar9 = "file2";
          auStackY_138._0_8_ = (void *)0x18b1a4;
          iVar2 = strcmp(unaff_R13,"file2");
          if (iVar2 != 0) {
            auStackY_138._0_8_ = (void *)0x18b512;
            run_test_fs_async_dir_cold_11();
            goto LAB_0018b512;
          }
        }
        dent.name = (char *)(ulong)uStackY_120.type;
        auStackY_138._0_8_ = (void *)0x18b1b5;
        dent._8_8_ = pcVar9;
        assert_is_file_type(dent);
        auStackY_138._0_8_ = (void *)0x18b1c0;
        iVar2 = uv_fs_scandir_next(&scandir_req,unaff_R15);
      } while (iVar2 != -0xfff);
    }
    auStackY_138._0_8_ = (void *)0x18b1d3;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_0018b5b3;
    auStackY_138._0_8_ = (void *)0x18b202;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5b8;
    auStackY_138._0_8_ = (void *)0x18b22e;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._0_8_ = (void *)0x18b24f;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5c5;
    auStackY_138._0_8_ = (void *)0x18b27b;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._0_8_ = (void *)0x18b29c;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5d2;
    auStackY_138._0_8_ = (void *)0x18b2c8;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._0_8_ = (void *)0x18b2e9;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5df;
    auStackY_138._0_8_ = (void *)0x18b315;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x4;
    puStackY_128 = (uv_loop_t *)(long)stat_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x4) goto LAB_0018b5ec;
    auStackY_138._0_8_ = (void *)0x18b359;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5f9;
    auStackY_138._0_8_ = (void *)0x18b385;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x1;
    puStackY_128 = (uv_loop_t *)(long)unlink_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x1) goto LAB_0018b606;
    auStackY_138._0_8_ = (void *)0x18b3c9;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b613;
    auStackY_138._0_8_ = (void *)0x18b3f5;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x2;
    puStackY_128 = (uv_loop_t *)(long)unlink_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x2) goto LAB_0018b620;
    auStackY_138._0_8_ = (void *)0x18b439;
    iVar2 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b62d;
    auStackY_138._0_8_ = (void *)0x18b465;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x1;
    puStackY_128 = (uv_loop_t *)(long)rmdir_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x1) goto LAB_0018b63a;
    auStackY_138._0_8_ = (void *)0x18b494;
    unlink("test_dir/file1");
    auStackY_138._0_8_ = (void *)0x18b4a0;
    unlink("test_dir/file2");
    auStackY_138._0_8_ = (void *)0x18b4ac;
    rmdir("test_dir");
    puVar4 = loop;
    auStackY_138._0_8_ = (void *)0x18b4c4;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStackY_138._0_8_ = (void *)0x18b4ce;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    auStackY_138._0_8_ = (void *)0x18b4e2;
    iVar2 = uv_loop_close(loop);
    puStackY_128 = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)auStackY_138._8_8_ == puStackY_128) {
      auStackY_138._0_8_ = (void *)0x18b4fd;
      uv_library_shutdown();
      return;
    }
  }
  else {
LAB_0018b512:
    auStackY_138._0_8_ = (void *)0x18b51f;
    run_test_fs_async_dir_cold_1();
LAB_0018b51f:
    auStackY_138._0_8_ = (void *)0x18b52c;
    run_test_fs_async_dir_cold_2();
LAB_0018b52c:
    puVar5 = puVar4;
    auStackY_138._0_8_ = (void *)0x18b539;
    run_test_fs_async_dir_cold_3();
LAB_0018b539:
    auStackY_138._0_8_ = (void *)0x18b546;
    run_test_fs_async_dir_cold_27();
LAB_0018b546:
    auStackY_138._0_8_ = (void *)0x18b553;
    run_test_fs_async_dir_cold_4();
LAB_0018b553:
    puVar4 = puVar5;
    auStackY_138._0_8_ = (void *)0x18b560;
    run_test_fs_async_dir_cold_5();
LAB_0018b560:
    auStackY_138._0_8_ = (void *)0x18b56d;
    run_test_fs_async_dir_cold_26();
LAB_0018b56d:
    auStackY_138._0_8_ = (void *)0x18b57a;
    run_test_fs_async_dir_cold_6();
LAB_0018b57a:
    auStackY_138._0_8_ = (void *)0x18b587;
    run_test_fs_async_dir_cold_7();
LAB_0018b587:
    auStackY_138._0_8_ = (void *)0x18b594;
    run_test_fs_async_dir_cold_8();
LAB_0018b594:
    auStackY_138._0_8_ = (void *)0x18b5a1;
    run_test_fs_async_dir_cold_9();
LAB_0018b5a1:
    auStackY_138._0_8_ = (void *)0x18b5ae;
    run_test_fs_async_dir_cold_10();
LAB_0018b5ae:
    auStackY_138._0_8_ = (void *)0x18b5b3;
    run_test_fs_async_dir_cold_25();
LAB_0018b5b3:
    auStackY_138._0_8_ = (void *)0x18b5b8;
    run_test_fs_async_dir_cold_12();
LAB_0018b5b8:
    auStackY_138._0_8_ = (void *)0x18b5c5;
    run_test_fs_async_dir_cold_13();
LAB_0018b5c5:
    auStackY_138._0_8_ = (void *)0x18b5d2;
    run_test_fs_async_dir_cold_14();
LAB_0018b5d2:
    auStackY_138._0_8_ = (void *)0x18b5df;
    run_test_fs_async_dir_cold_15();
LAB_0018b5df:
    auStackY_138._0_8_ = (void *)0x18b5ec;
    run_test_fs_async_dir_cold_16();
LAB_0018b5ec:
    auStackY_138._0_8_ = (void *)0x18b5f9;
    run_test_fs_async_dir_cold_17();
LAB_0018b5f9:
    auStackY_138._0_8_ = (void *)0x18b606;
    run_test_fs_async_dir_cold_18();
LAB_0018b606:
    auStackY_138._0_8_ = (void *)0x18b613;
    run_test_fs_async_dir_cold_19();
LAB_0018b613:
    auStackY_138._0_8_ = (void *)0x18b620;
    run_test_fs_async_dir_cold_20();
LAB_0018b620:
    auStackY_138._0_8_ = (void *)0x18b62d;
    run_test_fs_async_dir_cold_21();
LAB_0018b62d:
    auStackY_138._0_8_ = (void *)0x18b63a;
    run_test_fs_async_dir_cold_22();
LAB_0018b63a:
    auStackY_138._0_8_ = (void *)0x18b647;
    run_test_fs_async_dir_cold_23();
  }
  auStackY_138._0_8_ = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (puVar11 == &mkdir_req) {
    auStackY_138._0_8_ = SEXT48(mkdir_req.fs_type);
    p_StackY_140 = (uv_fs_cb)0x13;
    if ((code *)auStackY_138._0_8_ != (code *)0x13) goto LAB_0018b716;
    auStackY_138._0_8_ = mkdir_req.result;
    p_StackY_140 = (uv_fs_cb)0x0;
    if (mkdir_req.result != 0) goto LAB_0018b725;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_0018b734;
    uVar6 = *(ulong *)mkdir_req.path;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    if (uVar6 == 0x746573745f646972) {
      uVar7 = (uint)(byte)mkdir_req.path[8];
    }
    else {
      uVar7 = -(uint)(uVar6 < 0x746573745f646972) | 1;
    }
    auStackY_138._0_8_ = SEXT48((int)uVar7);
    p_StackY_140 = (uv_fs_cb)0x0;
    if ((code *)auStackY_138._0_8_ == (code *)0x0) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    puStackY_150 = (uv_dirent_t *)0x18b716;
    mkdir_cb_cold_1();
LAB_0018b716:
    puStackY_150 = (uv_dirent_t *)0x18b725;
    mkdir_cb_cold_2();
LAB_0018b725:
    puStackY_150 = (uv_dirent_t *)0x18b734;
    mkdir_cb_cold_3();
LAB_0018b734:
    puStackY_150 = (uv_dirent_t *)0x18b739;
    mkdir_cb_cold_5();
  }
  puVar11 = (uv_fs_t *)auStackY_138;
  puStackY_150 = (uv_dirent_t *)scandir_cb;
  mkdir_cb_cold_4();
  puVar10 = (uv_fs_t *)auStackY_190;
  puStackY_170 = puVar4;
  p_StackY_168 = unaff_R12;
  pcStackY_160 = unaff_R13;
  puStackY_158 = unaff_R14;
  puStackY_150 = unaff_R15;
  if (puVar11 == &scandir_req) {
    auStackY_190._8_8_ = SEXT48(scandir_req.fs_type);
    auStackY_190._0_8_ = (void *)0x16;
    if ((uv_loop_t *)auStackY_190._8_8_ != (uv_loop_t *)0x16) goto LAB_0018b8b0;
    auStackY_190._8_8_ = (uv_loop_t *)0x2;
    auStackY_190._0_8_ = scandir_req.result;
    if (scandir_req.result != 2) goto LAB_0018b8bd;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0018b8ca;
    pcStackY_198 = (code *)0x18b7ca;
    iVar2 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)(auStackY_190 + 8));
    if (iVar2 != -0xfff) {
      do {
        __s1 = auStackY_190._8_8_;
        pcVar9 = "file1";
        pcStackY_198 = (code *)0x18b7fb;
        iVar2 = strcmp((char *)auStackY_190._8_8_,"file1");
        if (iVar2 != 0) {
          pcVar9 = "file2";
          pcStackY_198 = (code *)0x18b80a;
          iVar2 = strcmp((char *)__s1,"file2");
          if (iVar2 != 0) {
            pcStackY_198 = (code *)0x18b8ab;
            scandir_cb_cold_4();
            goto LAB_0018b8ab;
          }
        }
        dent_00.name = (char *)(ulong)uStackY_180;
        pcStackY_198 = (code *)0x18b81b;
        dent_00._8_8_ = pcVar9;
        assert_is_file_type(dent_00);
        pcStackY_198 = (code *)0x18b826;
        iVar2 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)(auStackY_190 + 8));
      } while (iVar2 != -0xfff);
    }
    scandir_cb_count = scandir_cb_count + 1;
    if (scandir_req.path == (char *)0x0) goto LAB_0018b8cf;
    uVar6 = *(ulong *)scandir_req.path;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    if (uVar6 == 0x746573745f646972) {
      uVar7 = (uint)(byte)scandir_req.path[8];
    }
    else {
      uVar7 = -(uint)(uVar6 < 0x746573745f646972) | 1;
    }
    auStackY_190._0_8_ = SEXT48((int)uVar7);
    pvStackY_178 = (void *)0x0;
    if ((void *)auStackY_190._0_8_ != (void *)0x0) goto LAB_0018b8d4;
    puVar10 = &scandir_req;
    pcStackY_198 = (code *)0x18b88e;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_0018b8ab:
    pcStackY_198 = (code *)0x18b8b0;
    scandir_cb_cold_1();
LAB_0018b8b0:
    pcStackY_198 = (code *)0x18b8bd;
    scandir_cb_cold_2();
LAB_0018b8bd:
    pcStackY_198 = (code *)0x18b8ca;
    scandir_cb_cold_3();
LAB_0018b8ca:
    pcStackY_198 = (code *)0x18b8cf;
    scandir_cb_cold_8();
LAB_0018b8cf:
    pcStackY_198 = (code *)0x18b8d4;
    scandir_cb_cold_7();
LAB_0018b8d4:
    pcStackY_198 = (code *)0x18b8e1;
    scandir_cb_cold_5();
  }
  pcStackY_198 = assert_is_file_type;
  scandir_cb_cold_6();
  if ((uint)puVar10 < 2) {
    return;
  }
  auStackY_1b8._24_8_ = stat_cb;
  assert_is_file_type_cold_1();
  if (puVar10 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0018b961;
    auStackY_1b8._24_8_ = stat_req.result;
    auStackY_1b8._16_8_ = 0;
    if (stat_req.result != 0) goto LAB_0018b966;
    puVar11 = &stat_req;
    if (stat_req.ptr == (void *)0x0) goto LAB_0018b975;
    stat_cb_count = stat_cb_count + 1;
    puVar11 = &stat_req;
    auStackY_1b8._0_8_ = (void *)0x18b94d;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    auStackY_1b8._0_8_ = (void *)0x18b961;
    stat_cb_cold_1();
LAB_0018b961:
    auStackY_1b8._0_8_ = (void *)0x18b966;
    stat_cb_cold_2();
LAB_0018b966:
    puVar11 = (uv_fs_t *)(auStackY_1b8 + 0x18);
    auStackY_1b8._0_8_ = (void *)0x18b975;
    stat_cb_cold_3();
LAB_0018b975:
    auStackY_1b8._0_8_ = (void *)0x18b97a;
    stat_cb_cold_5();
  }
  auStackY_1b8._0_8_ = unlink_cb;
  stat_cb_cold_4();
  if (puVar11 == &unlink_req) {
    auStackY_1b8._0_8_ = SEXT48(unlink_req.fs_type);
    if ((code *)auStackY_1b8._0_8_ != (code *)0x11) goto LAB_0018b9ec;
    auStackY_1b8._0_8_ = unlink_req.result;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0018b9ec:
    unlink_cb_cold_2();
  }
  puVar11 = (uv_fs_t *)auStackY_1b8;
  unlink_cb_cold_3();
  if (puVar11 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0018bacc;
    if (rmdir_req.result != 0) goto LAB_0018badb;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      uVar6 = *(ulong *)rmdir_req.path;
      uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      if (uVar6 == 0x746573745f646972) {
        uVar7 = (uint)(byte)rmdir_req.path[8];
      }
      else {
        uVar7 = -(uint)(uVar6 < 0x746573745f646972) | 1;
      }
      if (uVar7 == 0) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_0018baef;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0018bacc:
    rmdir_cb_cold_2();
LAB_0018badb:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0018baef:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return;
}

Assistant:

static void create_cb(uv_fs_t* req) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* Event count here is still 0 so not going to check. */
  ASSERT_UINT64_EQ(1, metrics.loop_count);
  ASSERT_GE(req->result, 0);

  uv_fs_req_cleanup(req);
  last_events_count = metrics.events;

  uv_buf_t iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &fs_reqs.write_req,
                        (uv_os_fd_t) req->result,
                        &iov,
                        1,
                        0,
                        write_cb));
}